

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_store(parser *p)

{
  undefined2 uVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar2 = parser_getint(p,"value");
  if (wVar2 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar3 = strcmp(__s1,"inven-max");
    uVar1 = (undefined2)wVar2;
    if (iVar3 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x84) = uVar1;
    }
    else {
      iVar3 = strcmp(__s1,"turns");
      if (iVar3 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x86) = uVar1;
      }
      else {
        iVar3 = strcmp(__s1,"shuffle");
        if (iVar3 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x88) = uVar1;
        }
        else {
          iVar3 = strcmp(__s1,"magic-level");
          if (iVar3 != 0) {
            return PARSE_ERROR_UNDEFINED_DIRECTIVE;
          }
          *(undefined2 *)((long)pvVar4 + 0x8a) = uVar1;
        }
      }
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_store(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "inven-max"))
		z->store_inven_max = value;
	else if (streq(label, "turns"))
		z->store_turns = value;
	else if (streq(label, "shuffle"))
		z->store_shuffle = value;
	else if (streq(label, "magic-level"))
		z->store_magic_level = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}